

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.h
# Opt level: O0

void __thiscall bandit::detail::controller_t::~controller_t(controller_t *this)

{
  controller_t *this_local;
  
  std::
  unique_ptr<bandit::run_policy::interface,_std::default_delete<bandit::run_policy::interface>_>::
  ~unique_ptr(&this->run_policy);
  std::unique_ptr<bandit::reporter::interface,_std::default_delete<bandit::reporter::interface>_>::
  ~unique_ptr(&this->reporter);
  std::
  unique_ptr<bandit::failure_formatter::interface,_std::default_delete<bandit::failure_formatter::interface>_>
  ::~unique_ptr(&this->formatter);
  std::unique_ptr<bandit::colorizer::interface,_std::default_delete<bandit::colorizer::interface>_>
  ::~unique_ptr(&this->colorizer);
  std::unique_ptr<bandit::adapter::interface,_std::default_delete<bandit::adapter::interface>_>::
  ~unique_ptr(&this->adapter);
  context::stack_t::~stack_t(&this->context_stack);
  return;
}

Assistant:

context::stack_t& get_contexts() {
        return context_stack;
      }